

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void calculate_next_timer_intr(Emulator *e)

{
  Ticks TVar1;
  ulong uVar2;
  ulong uVar3;
  Ticks TVar4;
  ulong uVar5;
  int iVar6;
  u8 uVar7;
  int iVar8;
  bool bVar9;
  
  if ((e->state).timer.on == FALSE) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    TVar1 = (e->state).cpu_tick;
    iVar6 = *(int *)&(e->state).timer.div_counter;
    TVar4 = 0;
    bVar9 = (e->state).timer.tima_state == TIMA_STATE_OVERFLOW;
    if (bVar9) {
      TVar4 = TVar1;
      iVar6 = iVar6 + 4;
    }
    uVar5 = TVar4 + (e->state).timer.sync_ticks;
    uVar7 = (e->state).apu.so_volume[(ulong)bVar9 - 6];
    iVar8 = -5 - iVar6;
    while (((ushort)((ushort)iVar8 & s_tima_mask[(e->state).timer.clock_select] & (ushort)iVar6) ==
            0 || (uVar7 = uVar7 + '\x01', uVar7 != '\0'))) {
      uVar5 = uVar5 + TVar1;
      iVar8 = iVar8 + -4;
      iVar6 = iVar6 + 4;
    }
  }
  (e->state).timer.next_intr_ticks = uVar5;
  uVar2 = (e->state).serial.next_intr_ticks;
  uVar3 = (e->state).ppu.next_intr_ticks;
  if (uVar2 < uVar5) {
    uVar5 = uVar2;
  }
  if (uVar3 <= uVar5) {
    uVar5 = uVar3;
  }
  (e->state).next_intr_ticks = uVar5;
  return;
}

Assistant:

static void calculate_next_timer_intr(Emulator* e) {
  if (TIMER.on) {
    Ticks ticks = TIMER.sync_ticks;
    Ticks cpu_tick = e->state.cpu_tick;
    u16 div_counter = TIMER.div_counter;
    u8 tima = TIMER.tima;
    if (TIMER.tima_state == TIMA_STATE_OVERFLOW) {
      tima = TIMER.tma;
      div_counter += CPU_TICK;
      ticks += cpu_tick;
    }

    while (1) {
      u16 old_div_counter = div_counter;
      div_counter += CPU_TICK;
      if (is_div_falling_edge(e, old_div_counter, div_counter) && ++tima == 0) {
        break;
      }
      ticks += cpu_tick;
    }
    TIMER.next_intr_ticks = ticks;
  } else {
    TIMER.next_intr_ticks = INVALID_TICKS;
  }
  calculate_next_intr(e);
}